

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

void luaD_seterrorobj(lua_State *L,int errcode,StkId oldtop)

{
  byte bVar1;
  ushort uVar2;
  StkId pTVar3;
  TString *pTVar4;
  char *pcVar5;
  
  if (errcode == -2) {
    oldtop->tt_ = 0;
  }
  else {
    if (errcode == 6) {
      pTVar4 = luaS_newlstr(L,"error in error handling",0x17);
      if ((pTVar4->tt & 0xe) < 10) {
        (oldtop->value_).gc = (GCObject *)pTVar4;
        bVar1 = pTVar4->tt;
        oldtop->tt_ = bVar1 | 0x8000;
        if ((-1 < (char)bVar1) &&
           ((L == (lua_State *)0x0 || ((pTVar4->marked & (L->l_G->currentwhite ^ 0x18)) == 0))))
        goto LAB_00113e7c;
        pcVar5 = "0";
      }
      else {
        pcVar5 = "(((x_)->tt) & 0x0F) < (9+1)";
      }
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,0x68,"void luaD_seterrorobj(lua_State *, int, StkId)");
    }
    if (errcode == 4) {
      pTVar4 = L->l_G->memerrmsg;
      if ((pTVar4->tt & 0xe) < 10) {
        (oldtop->value_).gc = (GCObject *)pTVar4;
        bVar1 = pTVar4->tt;
        oldtop->tt_ = bVar1 | 0x8000;
        if ((-1 < (char)bVar1) &&
           ((L == (lua_State *)0x0 || ((pTVar4->marked & (L->l_G->currentwhite ^ 0x18)) == 0))))
        goto LAB_00113e7c;
        pcVar5 = "0";
      }
      else {
        pcVar5 = "(((x_)->tt) & 0x0F) < (9+1)";
      }
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,100,"void luaD_seterrorobj(lua_State *, int, StkId)");
    }
    pTVar3 = L->top;
    oldtop->value_ = pTVar3[-1].value_;
    uVar2 = pTVar3[-1].tt_;
    oldtop->tt_ = uVar2;
    if (((short)uVar2 < 0) &&
       (((uVar2 & 0x7f) != (ushort)((oldtop->value_).gc)->tt ||
        ((L != (lua_State *)0x0 &&
         ((((oldtop->value_).gc)->marked & (L->l_G->currentwhite ^ 0x18)) != 0)))))) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                    ,0x72,"void luaD_seterrorobj(lua_State *, int, StkId)");
    }
  }
LAB_00113e7c:
  L->top = oldtop + 1;
  return;
}

Assistant:

void luaD_seterrorobj (lua_State *L, int errcode, StkId oldtop) {
  switch (errcode) {
    case LUA_ERRMEM: {  /* memory error? */
      setsvalue2s(L, oldtop, G(L)->memerrmsg); /* reuse preregistered msg. */
      break;
    }
    case LUA_ERRERR: {
      setsvalue2s(L, oldtop, luaS_newliteral(L, "error in error handling"));
      break;
    }
#ifdef RAVI_DEFER_STATEMENT
    case CLOSEPROTECT: {
      setnilvalue(oldtop);  /* no error message */
      break;
    }
#endif
    default: {
      setobjs2s(L, oldtop, L->top - 1);  /* error message on current top */
      break;
    }
  }
  L->top = oldtop + 1;
}